

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_cleanup(Curl_multi *multi)

{
  Curl_easy *pCVar1;
  Curl_easy *nextdata;
  Curl_easy *data;
  Curl_multi *multi_local;
  
  if ((multi == (Curl_multi *)0x0) || (multi->type != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((multi->in_callback & 1U) == 0) {
    multi->type = 0;
    nextdata = multi->easyp;
    while (nextdata != (Curl_easy *)0x0) {
      pCVar1 = nextdata->next;
      if (((*(ushort *)&(nextdata->state).field_0x4e4 >> 0xb & 1) == 0) &&
         (nextdata->conn != (connectdata *)0x0)) {
        multi_done(nextdata,CURLE_OK,true);
      }
      if ((nextdata->dns).hostcachetype == HCACHE_MULTI) {
        Curl_hostcache_clean(nextdata,(nextdata->dns).hostcache);
        (nextdata->dns).hostcache = (curl_hash *)0x0;
        (nextdata->dns).hostcachetype = HCACHE_NONE;
      }
      (nextdata->state).conn_cache = (conncache *)0x0;
      nextdata->multi = (Curl_multi *)0x0;
      nextdata = pCVar1;
    }
    Curl_conncache_close_all_connections(&multi->conn_cache);
    Curl_hash_destroy(&multi->sockhash);
    Curl_conncache_destroy(&multi->conn_cache);
    Curl_llist_destroy(&multi->msglist,(void *)0x0);
    Curl_llist_destroy(&multi->pending,(void *)0x0);
    Curl_hash_destroy(&multi->hostcache);
    (*Curl_cfree)(multi);
    multi_local._4_4_ = CURLM_OK;
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_cleanup(struct Curl_multi *multi)
{
  struct Curl_easy *data;
  struct Curl_easy *nextdata;

  if(GOOD_MULTI_HANDLE(multi)) {
    if(multi->in_callback)
      return CURLM_RECURSIVE_API_CALL;

    multi->type = 0; /* not good anymore */

    /* Firsrt remove all remaining easy handles */
    data = multi->easyp;
    while(data) {
      nextdata = data->next;
      if(!data->state.done && data->conn)
        /* if DONE was never called for this handle */
        (void)multi_done(data, CURLE_OK, TRUE);
      if(data->dns.hostcachetype == HCACHE_MULTI) {
        /* clear out the usage of the shared DNS cache */
        Curl_hostcache_clean(data, data->dns.hostcache);
        data->dns.hostcache = NULL;
        data->dns.hostcachetype = HCACHE_NONE;
      }

      /* Clear the pointer to the connection cache */
      data->state.conn_cache = NULL;
      data->multi = NULL; /* clear the association */

#ifdef USE_LIBPSL
      if(data->psl == &multi->psl)
        data->psl = NULL;
#endif

      data = nextdata;
    }

    /* Close all the connections in the connection cache */
    Curl_conncache_close_all_connections(&multi->conn_cache);

    Curl_hash_destroy(&multi->sockhash);
    Curl_conncache_destroy(&multi->conn_cache);
    Curl_llist_destroy(&multi->msglist, NULL);
    Curl_llist_destroy(&multi->pending, NULL);

    Curl_hash_destroy(&multi->hostcache);
    Curl_psl_destroy(&multi->psl);
    free(multi);

    return CURLM_OK;
  }
  return CURLM_BAD_HANDLE;
}